

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O1

char * rtosc_match_options(char *pattern,char **msg)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = *msg;
  while( true ) {
    cVar1 = pattern[1];
    pattern = pattern + 1;
    if ((cVar1 == '}') || (cVar1 == ',')) break;
    cVar2 = **msg;
    if (cVar2 == '\0' || cVar1 != cVar2) {
      *msg = pcVar3;
      while( true ) {
        cVar1 = *pattern;
        if (cVar1 == '\0') {
          return (char *)0x0;
        }
        if (cVar1 == ',') break;
        if (cVar1 == '}') {
          return (char *)0x0;
        }
        pattern = pattern + 1;
      }
    }
    else {
      *msg = *msg + 1;
    }
  }
  for (; (cVar1 = *pattern, cVar1 != '\0' && (cVar1 != '}')); pattern = pattern + 1) {
  }
  return pattern + (cVar1 == '}');
}

Assistant:

const char *rtosc_match_options(const char *pattern, const char **msg)
{
    const char *preserve = *msg;
    assert(*pattern == '{');
    pattern++;

retry:

    while(1) {
        //Check for special characters
        if(*pattern == ',' || *pattern == '}') {
            goto advance_until_end;
        } else if((*pattern == **msg)) { //verbatim compare
            if(**msg)
                ++pattern, ++*msg;
            else
                goto try_next;
        } else
            goto try_next;
    }

advance_until_end:
    while(*pattern && *pattern != '}') pattern++;
    if(*pattern == '}')
        pattern++;
    return pattern;
try_next:
    *msg = preserve;
    while(*pattern && *pattern != '}' && *pattern != ',') pattern++;
    if(*pattern == ',') {
        pattern++;
        goto retry;
    }

    return NULL;
}